

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test.c
# Opt level: O0

int test_monster(flatcc_builder_t *B)

{
  int iVar1;
  char *pcVar2;
  size_t sStack_28;
  int ret;
  size_t size;
  void *buffer;
  flatcc_builder_t *B_local;
  
  buffer = B;
  gen_monster(B,0);
  size = (size_t)flatcc_builder_finalize_aligned_buffer
                           ((flatcc_builder_t *)buffer,&stack0xffffffffffffffd8);
  hexdump("monster table",(void *)size,sStack_28,_stderr);
  iVar1 = MyGame_Example_Monster_verify_as_root((void *)size,sStack_28);
  if (iVar1 == 0) {
    iVar1 = verify_monster((void *)size);
    flatcc_builder_aligned_free((void *)size);
    B_local._4_4_ = iVar1;
  }
  else {
    pcVar2 = flatcc_verify_error_string(iVar1);
    printf("Monster buffer failed to verify, got: %s\n",pcVar2);
    B_local._4_4_ = -1;
  }
  return B_local._4_4_;
}

Assistant:

int test_monster(flatcc_builder_t *B)
{
    void *buffer;
    size_t size;
    int ret;

    gen_monster(B, 0);

    buffer = flatcc_builder_finalize_aligned_buffer(B, &size);
    hexdump("monster table", buffer, size, stderr);
    if ((ret = ns(Monster_verify_as_root(buffer, size)))) {
        printf("Monster buffer failed to verify, got: %s\n", flatcc_verify_error_string(ret));
        return -1;
    }
    ret = verify_monster(buffer);

    flatcc_builder_aligned_free(buffer);
    return ret;
}